

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spdlog_impl.h
# Opt level: O0

shared_ptr<spdlog::logger> __thiscall
spdlog::create<spdlog::sinks::null_sink<spdlog::details::null_mutex>>
          (spdlog *this,string *logger_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  registry_t<std::mutex> *logger_name_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<spdlog::logger> sVar2;
  sinks_init_list sinks;
  element_type *local_a8;
  element_type local_58;
  element_type local_48;
  shared_ptr<spdlog::sinks::null_sink<spdlog::details::null_mutex>_> local_38;
  undefined1 local_28 [8];
  sink_ptr sink;
  string *logger_name_local;
  
  sink.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)logger_name;
  std::make_shared<spdlog::sinks::null_sink<spdlog::details::null_mutex>>();
  std::shared_ptr<spdlog::sinks::sink>::
  shared_ptr<spdlog::sinks::null_sink<spdlog::details::null_mutex>,void>
            ((shared_ptr<spdlog::sinks::sink> *)local_28,&local_38);
  std::shared_ptr<spdlog::sinks::null_sink<spdlog::details::null_mutex>_>::~shared_ptr(&local_38);
  logger_name_00 = details::registry_t<std::mutex>::instance();
  _Var1 = sink.super___shared_ptr<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  std::shared_ptr<spdlog::sinks::sink>::shared_ptr
            ((shared_ptr<spdlog::sinks::sink> *)&local_58,
             (shared_ptr<spdlog::sinks::sink> *)local_28);
  local_48._level.super___atomic_base<int>._M_i = (__atomic_base<int>)0x1;
  local_48._12_4_ = 0;
  sinks._M_len = (size_type)&local_58;
  sinks._M_array = (iterator)_Var1._M_pi;
  local_48._vptr_sink = (_func_int **)&local_58;
  details::registry_t<std::mutex>::create
            ((registry_t<std::mutex> *)this,(string *)logger_name_00,sinks);
  local_a8 = &local_48;
  do {
    local_a8 = local_a8 + -1;
    std::shared_ptr<spdlog::sinks::sink>::~shared_ptr((shared_ptr<spdlog::sinks::sink> *)local_a8);
  } while (local_a8 != &local_58);
  std::shared_ptr<spdlog::sinks::sink>::~shared_ptr((shared_ptr<spdlog::sinks::sink> *)local_28);
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<spdlog::logger>)
         sVar2.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<spdlog::logger> spdlog::create(const std::string &logger_name, Args... args)
{
    sink_ptr sink = std::make_shared<Sink>(args...);
    return details::registry::instance().create(logger_name, {sink});
}